

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O0

void __thiscall
ArgumentParser::Instance::
Parse<std::initializer_list<std::basic_string_view<char,std::char_traits<char>>>>
          (Instance *this,
          initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *args,size_t pos)

{
  string_view arg_00;
  const_iterator pbVar1;
  string_view arg;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *__range2;
  size_t pos_local;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *args_local;
  Instance *this_local;
  
  __end0 = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::begin
                     (args);
  pbVar1 = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::end(args);
  __range2 = (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)pos;
  for (; __end0 != pbVar1; __end0 = __end0 + 1) {
    arg_00._M_len = __end0->_M_len;
    arg_00._M_str = __end0->_M_str;
    Consume(this,(size_t)__range2,arg_00);
    __range2 = (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
               ((long)&__range2->_M_array + 1);
  }
  FinishKeyword(this);
  return;
}

Assistant:

void Parse(Range const& args, std::size_t pos = 0)
  {
    for (cm::string_view arg : args) {
      this->Consume(pos++, arg);
    }
    this->FinishKeyword();
  }